

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

optional<pbrt::CameraRay> * __thiscall
pbrt::SphericalCamera::GenerateRay
          (optional<pbrt::CameraRay> *__return_storage_ptr__,SphericalCamera *this,
          CameraSample sample,SampledWavelengths *lambda)

{
  undefined1 auVar1 [16];
  CameraSample CVar2;
  float sinTheta;
  float fVar3;
  Point2f p;
  undefined1 auVar4 [16];
  undefined1 extraout_var_00 [56];
  undefined1 auVar5 [64];
  undefined1 extraout_var [12];
  undefined1 auVar6 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  Vector3f VVar12;
  anon_struct_8_0_00000001_for___align local_78;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined8 uStack_64;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_58;
  SampledSpectrum local_50;
  Ray local_40;
  undefined1 auVar7 [56];
  undefined1 auVar11 [60];
  
  CVar2 = sample;
  auVar8._8_8_ = 0;
  auVar8._0_4_ = sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x;
  auVar8._4_4_ = sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y;
  auVar11 = ZEXT460((uint)CVar2.pFilm.super_Tuple2<pbrt::Point2,_float>.y);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)((this->super_CameraBase).film.
                            super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits &
                           0xffffffffffff);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vdivps_avx(auVar8,auVar4);
  if (this->mapping == EquiRectangular) {
    auVar8 = vmovshdup_avx(auVar4);
    fVar3 = auVar8._0_4_ * 3.1415927;
    sinTheta = sinf(fVar3);
    fVar3 = cosf(fVar3);
    auVar11 = ZEXT1260(extraout_var);
    auVar7 = (undefined1  [56])0x0;
    VVar12 = SphericalDirection(sinTheta,fVar3,auVar4._0_4_ * 6.2831855);
    auVar10._0_4_ = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar10._4_60_ = auVar11;
    auVar8 = auVar10._0_16_;
    auVar6._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar6._8_56_ = auVar7;
    auVar4 = auVar6._0_16_;
  }
  else {
    p = WrapEqualAreaSquare(auVar4._0_8_);
    auVar7 = extraout_var_00;
    VVar12 = EqualAreaSquareToSphere(p);
    auVar9._0_4_ = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar9._4_60_ = auVar11;
    auVar8 = auVar9._0_16_;
    auVar5._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar5._8_56_ = auVar7;
    auVar4 = auVar5._0_16_;
  }
  local_40.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )(this->super_CameraBase).medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  auVar8 = vinsertps_avx(auVar4,auVar8,0x10);
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(sample.time * (this->super_CameraBase).shutterClose)),
                           ZEXT416((uint)(1.0 - sample.time)),
                           ZEXT416((uint)(this->super_CameraBase).shutterOpen));
  local_40.o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_40.o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_40.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_40.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar8);
  local_40.d.super_Tuple3<pbrt::Vector3,_float>.z = (float)vextractps_avx(auVar4,1);
  local_40.time = auVar1._0_4_;
  CameraTransform::RenderFromCamera((Ray *)&local_78,(CameraTransform *)this,&local_40);
  SampledSpectrum::SampledSpectrum(&local_50,1.0);
  __return_storage_ptr__->set = true;
  (__return_storage_ptr__->optionalValue).__align = local_78;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) = CONCAT44(fStack_6c,fStack_70);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0xc) = CONCAT44(fStack_68,fStack_6c);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x14) = uStack_64;
  *(uintptr_t *)((long)&__return_storage_ptr__->optionalValue + 0x20) = local_58.bits;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) =
       local_50.values.values._0_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
       local_50.values.values._8_8_;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<CameraRay> SphericalCamera::GenerateRay(CameraSample sample,
                                                       SampledWavelengths &lambda) const {
    // Compute spherical camera ray direction
    Point2f uv(sample.pFilm.x / film.FullResolution().x,
               sample.pFilm.y / film.FullResolution().y);
    Vector3f dir;
    if (mapping == EquiRectangular) {
        // Compute ray direction using equirectangular mapping
        Float theta = Pi * uv[1], phi = 2 * Pi * uv[0];
        dir = SphericalDirection(std::sin(theta), std::cos(theta), phi);

    } else {
        // Compute ray direction using equal area mapping
        uv = WrapEqualAreaSquare(uv);
        dir = EqualAreaSquareToSphere(uv);
    }
    pstd::swap(dir.y, dir.z);

    Ray ray(Point3f(0, 0, 0), dir, SampleTime(sample.time), medium);
    return CameraRay{RenderFromCamera(ray)};
}